

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O3

void auxsort(lua_State *L,int l,int u)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_40;
  
  if (l < u) {
    do {
      lua_rawgeti(L,1,l);
      lua_rawgeti(L,1,u);
      iVar1 = sort_comp(L,-1,-2);
      if (iVar1 == 0) {
        lua_settop(L,-3);
      }
      else {
        lua_rawseti(L,1,l);
        lua_rawseti(L,1,u);
      }
      if (u - l == 1) {
        return;
      }
      local_40 = (u + l) / 2;
      lua_rawgeti(L,1,local_40);
      lua_rawgeti(L,1,l);
      iVar1 = sort_comp(L,-2,-1);
      if (iVar1 == 0) {
        lua_settop(L,-2);
        lua_rawgeti(L,1,u);
        iVar1 = sort_comp(L,-1,-2);
        if (iVar1 != 0) {
          lua_rawseti(L,1,local_40);
          iVar1 = u;
          goto LAB_0010e2c9;
        }
        lua_settop(L,-3);
      }
      else {
        lua_rawseti(L,1,local_40);
        iVar1 = l;
LAB_0010e2c9:
        lua_rawseti(L,1,iVar1);
      }
      if (u - l == 2) {
        return;
      }
      lua_rawgeti(L,1,local_40);
      lua_pushvalue(L,-1);
      iVar4 = u + -1;
      lua_rawgeti(L,1,iVar4);
      iVar1 = iVar4;
      iVar2 = l;
      do {
        iVar5 = iVar2;
        lua_rawseti(L,1,local_40);
        lua_rawseti(L,1,iVar1);
        local_40 = iVar5 + 1;
        lua_rawgeti(L,1,local_40);
        iVar2 = sort_comp(L,-1,-2);
        if (iVar2 != 0) {
          do {
            local_40 = iVar5;
            iVar5 = local_40 + 1;
            if (u <= iVar5) goto LAB_0010e4f7;
            lua_settop(L,-2);
            lua_rawgeti(L,1,local_40 + 2);
            iVar2 = sort_comp(L,-1,-2);
          } while (iVar2 != 0);
          local_40 = local_40 + 2;
        }
        lua_rawgeti(L,1,iVar1 + -1);
        iVar2 = sort_comp(L,-3,-1);
        iVar3 = iVar1;
        iVar1 = iVar1 + -1;
        if (iVar2 != 0) {
          do {
            iVar1 = iVar3;
            iVar3 = iVar1 + -1;
            if (iVar3 <= l) {
LAB_0010e4f7:
              lj_err_caller(L,LJ_ERR_TABSORT);
            }
            lua_settop(L,-2);
            lua_rawgeti(L,1,iVar1 + -2);
            iVar2 = sort_comp(L,-3,-1);
          } while (iVar2 != 0);
          iVar1 = iVar1 + -2;
        }
        iVar2 = local_40;
      } while (local_40 < iVar3);
      lua_settop(L,-4);
      lua_rawgeti(L,1,iVar4);
      lua_rawgeti(L,1,local_40);
      lua_rawseti(L,1,iVar4);
      lua_rawseti(L,1,local_40);
      iVar1 = iVar5 + 2;
      iVar2 = u;
      iVar4 = iVar5;
      if (local_40 - l < u - local_40) {
        iVar1 = l;
        iVar2 = iVar5;
        iVar4 = u;
        l = iVar5 + 2;
      }
      u = iVar4;
      auxsort(L,iVar1,iVar2);
    } while (l < u);
  }
  return;
}

Assistant:

static void auxsort(lua_State *L, int l, int u)
{
  while (l < u) {  /* for tail recursion */
    int i, j;
    /* sort elements a[l], a[(l+u)/2] and a[u] */
    lua_rawgeti(L, 1, l);
    lua_rawgeti(L, 1, u);
    if (sort_comp(L, -1, -2))  /* a[u] < a[l]? */
      set2(L, l, u);  /* swap a[l] - a[u] */
    else
      lua_pop(L, 2);
    if (u-l == 1) break;  /* only 2 elements */
    i = (l+u)/2;
    lua_rawgeti(L, 1, i);
    lua_rawgeti(L, 1, l);
    if (sort_comp(L, -2, -1)) {  /* a[i]<a[l]? */
      set2(L, i, l);
    } else {
      lua_pop(L, 1);  /* remove a[l] */
      lua_rawgeti(L, 1, u);
      if (sort_comp(L, -1, -2))  /* a[u]<a[i]? */
	set2(L, i, u);
      else
	lua_pop(L, 2);
    }
    if (u-l == 2) break;  /* only 3 elements */
    lua_rawgeti(L, 1, i);  /* Pivot */
    lua_pushvalue(L, -1);
    lua_rawgeti(L, 1, u-1);
    set2(L, i, u-1);
    /* a[l] <= P == a[u-1] <= a[u], only need to sort from l+1 to u-2 */
    i = l; j = u-1;
    for (;;) {  /* invariant: a[l..i] <= P <= a[j..u] */
      /* repeat ++i until a[i] >= P */
      while (lua_rawgeti(L, 1, ++i), sort_comp(L, -1, -2)) {
	if (i>=u) lj_err_caller(L, LJ_ERR_TABSORT);
	lua_pop(L, 1);  /* remove a[i] */
      }
      /* repeat --j until a[j] <= P */
      while (lua_rawgeti(L, 1, --j), sort_comp(L, -3, -1)) {
	if (j<=l) lj_err_caller(L, LJ_ERR_TABSORT);
	lua_pop(L, 1);  /* remove a[j] */
      }
      if (j<i) {
	lua_pop(L, 3);  /* pop pivot, a[i], a[j] */
	break;
      }
      set2(L, i, j);
    }
    lua_rawgeti(L, 1, u-1);
    lua_rawgeti(L, 1, i);
    set2(L, u-1, i);  /* swap pivot (a[u-1]) with a[i] */
    /* a[l..i-1] <= a[i] == P <= a[i+1..u] */
    /* adjust so that smaller half is in [j..i] and larger one in [l..u] */
    if (i-l < u-i) {
      j=l; i=i-1; l=i+2;
    } else {
      j=i+1; i=u; u=j-2;
    }
    auxsort(L, j, i);  /* call recursively the smaller one */
  }  /* repeat the routine for the larger one */
}